

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge.cc
# Opt level: O0

void __thiscall Merge::inflate(Merge *this,Varnode *a,HighVariable *high)

{
  int4 iVar1;
  HighVariable *pHVar2;
  Varnode *pVVar3;
  Varnode *b;
  int4 i;
  HighVariable *high_local;
  Varnode *a_local;
  Merge *this_local;
  
  pHVar2 = Varnode::getHigh(a);
  updateHigh(this,pHVar2);
  updateHigh(this,high);
  b._4_4_ = 0;
  while( true ) {
    iVar1 = HighVariable::numInstances(high);
    if (iVar1 <= b._4_4_) break;
    pVVar3 = HighVariable::getInstance(high,b._4_4_);
    Cover::merge(a->cover,pVVar3->cover);
    b._4_4_ = b._4_4_ + 1;
  }
  pHVar2 = Varnode::getHigh(a);
  HighVariable::coverDirty(pHVar2);
  return;
}

Assistant:

void Merge::inflate(Varnode *a,HighVariable *high)

{
  updateHigh(a->getHigh());
  updateHigh(high);
  for(int4 i=0;i<high->numInstances();++i) {
    Varnode *b = high->getInstance(i);
    a->cover->merge(*b->cover);
  }
  a->getHigh()->coverDirty();
}